

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_decode.c
# Opt level: O0

cram_block_compression_hdr * cram_decode_compression_header(cram_fd *fd,cram_block *b)

{
  char *pcVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  byte *pbVar5;
  SAM_hdr *pSVar6;
  kh_map_t *pkVar7;
  pmap_t cp_00;
  cram_metrics *pcVar8;
  cram_codec *pcVar9;
  char *pcVar10;
  int local_194;
  int local_190;
  int local_18c;
  int local_188;
  int local_184;
  int local_180;
  int local_17c;
  int local_178;
  int local_174;
  int local_170;
  int local_16c;
  int local_168;
  int local_164;
  int local_160;
  int local_15c;
  int local_158;
  int local_154;
  int local_150;
  int local_14c;
  int local_148;
  int local_144;
  int local_140;
  int local_13c;
  int local_138;
  int local_134;
  int local_130;
  int local_12c;
  int local_128;
  int local_124;
  int local_120;
  int local_11c;
  int local_118;
  int local_110;
  int local_10c;
  int local_108;
  int local_104;
  int local_100;
  int local_fc;
  int local_f8;
  int local_f4;
  int local_f0;
  int local_ec;
  int local_e8;
  int local_e4;
  int local_e0;
  int local_dc;
  int local_d8;
  int local_d4;
  int local_d0;
  int local_cc;
  int local_c8;
  int local_c4;
  int local_c0;
  int local_bc;
  int local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  int local_98;
  int local_94;
  char *key_1;
  cram_map *m_1;
  int32_t size_1;
  int32_t encoding_1;
  cram_map *m;
  int32_t size;
  int32_t encoding;
  char *key;
  int local_58;
  int sz;
  int r;
  khint_t k;
  pmap_t hd;
  uint local_40;
  int32_t map_count;
  int32_t map_size;
  int i;
  cram_block_compression_hdr *hdr;
  char *cp_copy;
  char *cp;
  cram_block *b_local;
  cram_fd *fd_local;
  
  cp = (char *)b;
  b_local = (cram_block *)fd;
  _map_size = (cram_fd *)calloc(1,0x418);
  if (_map_size == (cram_fd *)0x0) {
    fd_local = (cram_fd *)0x0;
  }
  else if ((*(int *)cp == 0) || (iVar3 = cram_uncompress_block((cram_block *)cp), iVar3 == 0)) {
    cp_copy = *(char **)(cp + 0x20);
    if (b_local->content_id >> 8 == 1) {
      if ((byte)*cp_copy < 0x80) {
        *(uint *)&_map_size->fp = (uint)(byte)*cp_copy;
        local_94 = 1;
      }
      else {
        if ((byte)*cp_copy < 0xc0) {
          *(uint *)&_map_size->fp = CONCAT11(*cp_copy,((byte *)cp_copy)[1]) & 0x3fff;
          local_98 = 2;
        }
        else {
          if ((byte)*cp_copy < 0xe0) {
            *(uint *)&_map_size->fp =
                 ((byte)*cp_copy & 0x1f) << 0x10 | (uint)((byte *)cp_copy)[1] << 8 |
                 (uint)((byte *)cp_copy)[2];
            local_9c = 3;
          }
          else {
            if ((byte)*cp_copy < 0xf0) {
              *(uint *)&_map_size->fp =
                   ((byte)*cp_copy & 0xf) << 0x18 | (uint)((byte *)cp_copy)[1] << 0x10 |
                   (uint)((byte *)cp_copy)[2] << 8 | (uint)((byte *)cp_copy)[3];
              local_a0 = 4;
            }
            else {
              *(uint *)&_map_size->fp =
                   (uint)(byte)*cp_copy << 0x1c | (uint)((byte *)cp_copy)[1] << 0x14 |
                   (uint)((byte *)cp_copy)[2] << 0xc | (uint)((byte *)cp_copy)[3] << 4 |
                   ((byte *)cp_copy)[4] & 0xf;
              local_a0 = 5;
            }
            local_9c = local_a0;
          }
          local_98 = local_9c;
        }
        local_94 = local_98;
      }
      pbVar5 = (byte *)cp_copy + local_94;
      if (*pbVar5 < 0x80) {
        *(uint *)((long)&_map_size->fp + 4) = (uint)*pbVar5;
        local_a4 = 1;
      }
      else {
        if (*pbVar5 < 0xc0) {
          *(uint *)((long)&_map_size->fp + 4) = CONCAT11(*pbVar5,pbVar5[1]) & 0x3fff;
          local_a8 = 2;
        }
        else {
          if (*pbVar5 < 0xe0) {
            *(uint *)((long)&_map_size->fp + 4) =
                 (*pbVar5 & 0x1f) << 0x10 | (uint)pbVar5[1] << 8 | (uint)pbVar5[2];
            local_ac = 3;
          }
          else {
            if (*pbVar5 < 0xf0) {
              *(uint *)((long)&_map_size->fp + 4) =
                   (*pbVar5 & 0xf) << 0x18 | (uint)pbVar5[1] << 0x10 | (uint)pbVar5[2] << 8 |
                   (uint)pbVar5[3];
              local_b0 = 4;
            }
            else {
              *(uint *)((long)&_map_size->fp + 4) =
                   (uint)*pbVar5 << 0x1c | (uint)pbVar5[1] << 0x14 | (uint)pbVar5[2] << 0xc |
                   (uint)pbVar5[3] << 4 | pbVar5[4] & 0xf;
              local_b0 = 5;
            }
            local_ac = local_b0;
          }
          local_a8 = local_ac;
        }
        local_a4 = local_a8;
      }
      pbVar5 = pbVar5 + local_a4;
      if (*pbVar5 < 0x80) {
        _map_size->mode = (uint)*pbVar5;
        local_b4 = 1;
      }
      else {
        if (*pbVar5 < 0xc0) {
          _map_size->mode = CONCAT11(*pbVar5,pbVar5[1]) & 0x3fff;
          local_b8 = 2;
        }
        else {
          if (*pbVar5 < 0xe0) {
            _map_size->mode = (*pbVar5 & 0x1f) << 0x10 | (uint)pbVar5[1] << 8 | (uint)pbVar5[2];
            local_bc = 3;
          }
          else {
            if (*pbVar5 < 0xf0) {
              _map_size->mode =
                   (*pbVar5 & 0xf) << 0x18 | (uint)pbVar5[1] << 0x10 | (uint)pbVar5[2] << 8 |
                   (uint)pbVar5[3];
              local_c0 = 4;
            }
            else {
              _map_size->mode =
                   (uint)*pbVar5 << 0x1c | (uint)pbVar5[1] << 0x14 | (uint)pbVar5[2] << 0xc |
                   (uint)pbVar5[3] << 4 | pbVar5[4] & 0xf;
              local_c0 = 5;
            }
            local_bc = local_c0;
          }
          local_b8 = local_bc;
        }
        local_b4 = local_b8;
      }
      pbVar5 = pbVar5 + local_b4;
      if (*pbVar5 < 0x80) {
        _map_size->version = (uint)*pbVar5;
        local_c4 = 1;
      }
      else {
        if (*pbVar5 < 0xc0) {
          _map_size->version = CONCAT11(*pbVar5,pbVar5[1]) & 0x3fff;
          local_c8 = 2;
        }
        else {
          if (*pbVar5 < 0xe0) {
            _map_size->version = (*pbVar5 & 0x1f) << 0x10 | (uint)pbVar5[1] << 8 | (uint)pbVar5[2];
            local_cc = 3;
          }
          else {
            if (*pbVar5 < 0xf0) {
              _map_size->version =
                   (*pbVar5 & 0xf) << 0x18 | (uint)pbVar5[1] << 0x10 | (uint)pbVar5[2] << 8 |
                   (uint)pbVar5[3];
              local_d0 = 4;
            }
            else {
              _map_size->version =
                   (uint)*pbVar5 << 0x1c | (uint)pbVar5[1] << 0x14 | (uint)pbVar5[2] << 0xc |
                   (uint)pbVar5[3] << 4 | pbVar5[4] & 0xf;
              local_d0 = 5;
            }
            local_cc = local_d0;
          }
          local_c8 = local_cc;
        }
        local_c4 = local_c8;
      }
      pbVar5 = pbVar5 + local_c4;
      if (*pbVar5 < 0x80) {
        *(uint *)&_map_size->file_def = (uint)*pbVar5;
        local_d4 = 1;
      }
      else {
        if (*pbVar5 < 0xc0) {
          *(uint *)&_map_size->file_def = CONCAT11(*pbVar5,pbVar5[1]) & 0x3fff;
          local_d8 = 2;
        }
        else {
          if (*pbVar5 < 0xe0) {
            *(uint *)&_map_size->file_def =
                 (*pbVar5 & 0x1f) << 0x10 | (uint)pbVar5[1] << 8 | (uint)pbVar5[2];
            local_dc = 3;
          }
          else {
            if (*pbVar5 < 0xf0) {
              *(uint *)&_map_size->file_def =
                   (*pbVar5 & 0xf) << 0x18 | (uint)pbVar5[1] << 0x10 | (uint)pbVar5[2] << 8 |
                   (uint)pbVar5[3];
              local_e0 = 4;
            }
            else {
              *(uint *)&_map_size->file_def =
                   (uint)*pbVar5 << 0x1c | (uint)pbVar5[1] << 0x14 | (uint)pbVar5[2] << 0xc |
                   (uint)pbVar5[3] << 4 | pbVar5[4] & 0xf;
              local_e0 = 5;
            }
            local_dc = local_e0;
          }
          local_d8 = local_dc;
        }
        local_d4 = local_d8;
      }
      cp_copy = (char *)(pbVar5 + local_d4);
      pSVar6 = (SAM_hdr *)malloc((long)*(int *)&_map_size->file_def << 2);
      _map_size->header = pSVar6;
      if (pSVar6 == (SAM_hdr *)0x0) {
        free(_map_size);
        return (cram_block_compression_hdr *)0x0;
      }
      for (map_count = 0; map_count < *(int *)&_map_size->file_def; map_count = map_count + 1) {
        if ((byte)*cp_copy < 0x80) {
          *(uint *)((long)&(_map_size->header->text).l + (long)map_count * 4) = (uint)(byte)*cp_copy
          ;
          local_e4 = 1;
        }
        else {
          if ((byte)*cp_copy < 0xc0) {
            *(uint *)((long)&(_map_size->header->text).l + (long)map_count * 4) =
                 CONCAT11(*cp_copy,cp_copy[1]) & 0x3fff;
            local_e8 = 2;
          }
          else {
            if ((byte)*cp_copy < 0xe0) {
              *(uint *)((long)&(_map_size->header->text).l + (long)map_count * 4) =
                   ((byte)*cp_copy & 0x1f) << 0x10 | (uint)(byte)cp_copy[1] << 8 |
                   (uint)(byte)cp_copy[2];
              local_ec = 3;
            }
            else {
              if ((byte)*cp_copy < 0xf0) {
                *(uint *)((long)&(_map_size->header->text).l + (long)map_count * 4) =
                     ((byte)*cp_copy & 0xf) << 0x18 | (uint)(byte)cp_copy[1] << 0x10 |
                     (uint)(byte)cp_copy[2] << 8 | (uint)(byte)cp_copy[3];
                local_f0 = 4;
              }
              else {
                *(uint *)((long)&(_map_size->header->text).l + (long)map_count * 4) =
                     (uint)(byte)*cp_copy << 0x1c | (uint)(byte)cp_copy[1] << 0x14 |
                     (uint)(byte)cp_copy[2] << 0xc | (uint)(byte)cp_copy[3] << 4 |
                     (byte)cp_copy[4] & 0xf;
                local_f0 = 5;
              }
              local_ec = local_f0;
            }
            local_e8 = local_ec;
          }
          local_e4 = local_e8;
        }
        cp_copy = cp_copy + local_e4;
      }
    }
    pkVar7 = kh_init_map();
    *(kh_map_t **)&_map_size->level = pkVar7;
    memset(_map_size->m,0,0x100);
    memset(_map_size->m + 0x20,0,0x100);
    if (*(kh_map_t **)&_map_size->level == (kh_map_t *)0x0) {
      cram_free_compression_header((cram_block_compression_hdr *)_map_size);
      fd_local = (cram_fd *)0x0;
    }
    else {
      *(int *)&_map_size->prefix = 0;
      *(int *)((long)&_map_size->prefix + 4) = 0;
      *(int *)&_map_size->record_counter = 0;
      *(int *)((long)&_map_size->record_counter + 4) = 0;
      _map_size->err = 0;
      *(int *)&_map_size->field_0x34 = 1;
      *(char *)&_map_size->ctr = 'C';
      *(char *)((long)&_map_size->ctr + 1) = 'G';
      *(char *)((long)&_map_size->ctr + 2) = 'T';
      *(char *)((long)&_map_size->ctr + 3) = 'N';
      *(char *)((long)&_map_size->ctr + 4) = 'A';
      *(char *)((long)&_map_size->ctr + 5) = 'G';
      *(char *)((long)&_map_size->ctr + 6) = 'T';
      *(char *)((long)&_map_size->ctr + 7) = 'N';
      *(undefined8 *)&_map_size->first_base = 0x4e4743414e544341;
      *(undefined4 *)&_map_size->refs = 0x54474341;
      if ((byte)*cp_copy < 0x80) {
        local_40 = (uint)(byte)*cp_copy;
        local_f4 = 1;
      }
      else {
        if ((byte)*cp_copy < 0xc0) {
          local_40 = CONCAT11(*cp_copy,cp_copy[1]) & 0x3fff;
          local_f8 = 2;
        }
        else {
          if ((byte)*cp_copy < 0xe0) {
            local_40 = ((byte)*cp_copy & 0x1f) << 0x10 | (uint)(byte)cp_copy[1] << 8 |
                       (uint)(byte)cp_copy[2];
            local_fc = 3;
          }
          else {
            if ((byte)*cp_copy < 0xf0) {
              local_40 = ((byte)*cp_copy & 0xf) << 0x18 | (uint)(byte)cp_copy[1] << 0x10 |
                         (uint)(byte)cp_copy[2] << 8 | (uint)(byte)cp_copy[3];
              local_100 = 4;
            }
            else {
              local_40 = (uint)(byte)*cp_copy << 0x1c | (uint)(byte)cp_copy[1] << 0x14 |
                         (uint)(byte)cp_copy[2] << 0xc | (uint)(byte)cp_copy[3] << 4 |
                         (byte)cp_copy[4] & 0xf;
              local_100 = 5;
            }
            local_fc = local_100;
          }
          local_f8 = local_fc;
        }
        local_f4 = local_f8;
      }
      hdr = (cram_block_compression_hdr *)(cp_copy + local_f4);
      if ((byte)hdr->ref_seq_id < 0x80) {
        hd._4_4_ = ZEXT14((byte)hdr->ref_seq_id);
        local_104 = 1;
      }
      else {
        if ((byte)hdr->ref_seq_id < 0xc0) {
          hd._4_4_ = CONCAT11((char)hdr->ref_seq_id,*(undefined1 *)((long)&hdr->ref_seq_id + 1)) &
                     0x3fff;
          local_108 = 2;
        }
        else {
          if ((byte)hdr->ref_seq_id < 0xe0) {
            hd._4_4_ = ((byte)hdr->ref_seq_id & 0x1f) << 0x10 |
                       (uint)*(byte *)((long)&hdr->ref_seq_id + 1) << 8 |
                       (uint)*(byte *)((long)&hdr->ref_seq_id + 2);
            local_10c = 3;
          }
          else {
            if ((byte)hdr->ref_seq_id < 0xf0) {
              hd._4_4_ = ((byte)hdr->ref_seq_id & 0xf) << 0x18 |
                         (uint)*(byte *)((long)&hdr->ref_seq_id + 1) << 0x10 |
                         (uint)*(byte *)((long)&hdr->ref_seq_id + 2) << 8 |
                         (uint)*(byte *)((long)&hdr->ref_seq_id + 3);
              local_110 = 4;
            }
            else {
              hd._4_4_ = (uint)(byte)hdr->ref_seq_id << 0x1c |
                         (uint)*(byte *)((long)&hdr->ref_seq_id + 1) << 0x14 |
                         (uint)*(byte *)((long)&hdr->ref_seq_id + 2) << 0xc |
                         (uint)*(byte *)((long)&hdr->ref_seq_id + 3) << 4 |
                         (byte)hdr->ref_seq_start & 0xf;
              local_110 = 5;
            }
            local_10c = local_110;
          }
          local_108 = local_10c;
        }
        local_104 = local_108;
      }
      cp_copy = (char *)((long)&((cram_block_compression_hdr *)(hdr->substitution_matrix + -0xe))->
                                ref_seq_id + (long)local_104);
      for (map_count = 0; map_count < (int)hd._4_4_; map_count = map_count + 1) {
        cp_00.p = cp_copy + 2;
        uVar4 = (int)*cp_copy << 8 | (int)cp_copy[1];
        if (uVar4 == 0x4150) {
          cp_copy = cp_copy + 3;
          r = (int)*cp_00.p;
          sz = kh_put_map(*(kh_map_t **)&_map_size->level,"AP",&local_58);
          if (local_58 == -1) {
            cram_free_compression_header((cram_block_compression_hdr *)_map_size);
            return (cram_block_compression_hdr *)0x0;
          }
          (*(kh_map_t **)&_map_size->level)->vals[(uint)sz] = _r;
          *(int *)&_map_size->field_0x34 = r;
        }
        else if (uVar4 == 0x4d49) {
          cp_copy = cp_copy + 3;
          r = (int)*cp_00.p;
          sz = kh_put_map(*(kh_map_t **)&_map_size->level,"MI",&local_58);
          if (local_58 == -1) {
            cram_free_compression_header((cram_block_compression_hdr *)_map_size);
            return (cram_block_compression_hdr *)0x0;
          }
          (*(kh_map_t **)&_map_size->level)->vals[(uint)sz] = _r;
          *(int *)&_map_size->prefix = r;
        }
        else if (uVar4 == 0x5049) {
          cp_copy = cp_copy + 3;
          r = (int)*cp_00.p;
          sz = kh_put_map(*(kh_map_t **)&_map_size->level,"PI",&local_58);
          if (local_58 == -1) {
            cram_free_compression_header((cram_block_compression_hdr *)_map_size);
            return (cram_block_compression_hdr *)0x0;
          }
          (*(kh_map_t **)&_map_size->level)->vals[(uint)sz] = _r;
          *(int *)&_map_size->record_counter = r;
        }
        else if (uVar4 == 0x524e) {
          cp_copy = cp_copy + 3;
          r = (int)*cp_00.p;
          sz = kh_put_map(*(kh_map_t **)&_map_size->level,"RN",&local_58);
          if (local_58 == -1) {
            cram_free_compression_header((cram_block_compression_hdr *)_map_size);
            return (cram_block_compression_hdr *)0x0;
          }
          (*(kh_map_t **)&_map_size->level)->vals[(uint)sz] = _r;
          _map_size->err = r;
        }
        else if (uVar4 == 0x5252) {
          cp_copy = cp_copy + 3;
          r = (int)*cp_00.p;
          sz = kh_put_map(*(kh_map_t **)&_map_size->level,"RR",&local_58);
          if (local_58 == -1) {
            cram_free_compression_header((cram_block_compression_hdr *)_map_size);
            return (cram_block_compression_hdr *)0x0;
          }
          (*(kh_map_t **)&_map_size->level)->vals[(uint)sz] = _r;
          b_local[8].content_id = (uint)((r != 0 ^ 0xffU) & 1);
        }
        else if (uVar4 == 0x534d) {
          *(undefined1 *)((long)_map_size->m + (long)(int)((int)*cp_00.p >> 6 & 3) + -0x48) = 0x43;
          *(undefined1 *)((long)_map_size->m + (long)(int)((int)*cp_00.p >> 4 & 3) + -0x48) = 0x47;
          *(undefined1 *)((long)_map_size->m + (long)(int)((int)*cp_00.p >> 2 & 3) + -0x48) = 0x54;
          *(undefined1 *)((long)_map_size->m + (long)(int)((int)*cp_00.p & 3) + -0x48) = 0x4e;
          *(undefined1 *)((long)_map_size->m + (long)(int)((int)cp_copy[3] >> 6 & 3) + -0x44) = 0x41
          ;
          *(undefined1 *)((long)_map_size->m + (long)(int)((int)cp_copy[3] >> 4 & 3) + -0x44) = 0x47
          ;
          *(undefined1 *)((long)_map_size->m + (long)(int)((int)cp_copy[3] >> 2 & 3) + -0x44) = 0x54
          ;
          *(undefined1 *)((long)_map_size->m + (long)(int)((int)cp_copy[3] & 3) + -0x44) = 0x4e;
          *(undefined1 *)((long)_map_size->m + (long)(int)((int)cp_copy[4] >> 6 & 3) + -0x40) = 0x41
          ;
          *(undefined1 *)((long)_map_size->m + (long)(int)((int)cp_copy[4] >> 4 & 3) + -0x40) = 0x43
          ;
          *(undefined1 *)((long)_map_size->m + (long)(int)((int)cp_copy[4] >> 2 & 3) + -0x40) = 0x54
          ;
          *(undefined1 *)((long)_map_size->m + (long)(int)((int)cp_copy[4] & 3) + -0x40) = 0x4e;
          *(undefined1 *)((long)_map_size->m + (long)(int)((int)cp_copy[5] >> 6 & 3) + -0x3c) = 0x41
          ;
          *(undefined1 *)((long)_map_size->m + (long)(int)((int)cp_copy[5] >> 4 & 3) + -0x3c) = 0x43
          ;
          *(undefined1 *)((long)_map_size->m + (long)(int)((int)cp_copy[5] >> 2 & 3) + -0x3c) = 0x47
          ;
          *(undefined1 *)((long)_map_size->m + (long)(int)((int)cp_copy[5] & 3) + -0x3c) = 0x4e;
          *(undefined1 *)((long)_map_size->m + (long)(int)((int)cp_copy[6] >> 6 & 3) + -0x38) = 0x41
          ;
          *(undefined1 *)((long)_map_size->m + (long)(int)((int)cp_copy[6] >> 4 & 3) + -0x38) = 0x43
          ;
          *(undefined1 *)((long)_map_size->m + (long)(int)((int)cp_copy[6] >> 2 & 3) + -0x38) = 0x47
          ;
          *(undefined1 *)((long)_map_size->m + (long)(int)((int)cp_copy[6] & 3) + -0x38) = 0x54;
          cp_copy = cp_copy + 7;
          _r = cp_00.p;
          sz = kh_put_map(*(kh_map_t **)&_map_size->level,"SM",&local_58);
          if (local_58 == -1) {
            cram_free_compression_header((cram_block_compression_hdr *)_map_size);
            return (cram_block_compression_hdr *)0x0;
          }
          (*(kh_map_t **)&_map_size->level)->vals[(uint)sz].p = (char *)_r;
        }
        else if (uVar4 == 0x5444) {
          cp_copy = cp_00.p;
          iVar3 = cram_decode_TD(cp_00.p,(cram_block_compression_hdr *)_map_size);
          if (iVar3 < 0) {
            cram_free_compression_header((cram_block_compression_hdr *)_map_size);
            return (cram_block_compression_hdr *)0x0;
          }
          _r = cp_copy;
          cp_copy = cp_copy + iVar3;
          sz = kh_put_map(*(kh_map_t **)&_map_size->level,"TD",&local_58);
          if (local_58 == -1) {
            cram_free_compression_header((cram_block_compression_hdr *)_map_size);
            return (cram_block_compression_hdr *)0x0;
          }
          (*(kh_map_t **)&_map_size->level)->vals[(uint)sz].p = (char *)_r;
        }
        else if (uVar4 == 0x5549) {
          cp_copy = cp_copy + 3;
          r = (int)*cp_00.p;
          sz = kh_put_map(*(kh_map_t **)&_map_size->level,"UI",&local_58);
          if (local_58 == -1) {
            cram_free_compression_header((cram_block_compression_hdr *)_map_size);
            return (cram_block_compression_hdr *)0x0;
          }
          (*(kh_map_t **)&_map_size->level)->vals[(uint)sz] = _r;
          *(int *)((long)&_map_size->prefix + 4) = r;
        }
        else {
          cVar2 = *cp_copy;
          pcVar1 = cp_copy + 1;
          cp_copy = cp_00.p;
          fprintf(_stderr,"Unrecognised preservation map key %c%c\n",(ulong)(uint)(int)cVar2,
                  (ulong)(uint)(int)*pcVar1);
          cp_copy = cp_copy + 1;
        }
      }
      if ((long)cp_copy - (long)hdr == (long)(int)local_40) {
        if ((byte)*cp_copy < 0x80) {
          local_40 = (uint)(byte)*cp_copy;
          local_118 = 1;
        }
        else {
          if ((byte)*cp_copy < 0xc0) {
            local_40 = CONCAT11(*cp_copy,cp_copy[1]) & 0x3fff;
            local_11c = 2;
          }
          else {
            if ((byte)*cp_copy < 0xe0) {
              local_40 = ((byte)*cp_copy & 0x1f) << 0x10 | (uint)(byte)cp_copy[1] << 8 |
                         (uint)(byte)cp_copy[2];
              local_120 = 3;
            }
            else {
              if ((byte)*cp_copy < 0xf0) {
                local_40 = ((byte)*cp_copy & 0xf) << 0x18 | (uint)(byte)cp_copy[1] << 0x10 |
                           (uint)(byte)cp_copy[2] << 8 | (uint)(byte)cp_copy[3];
                local_124 = 4;
              }
              else {
                local_40 = (uint)(byte)*cp_copy << 0x1c | (uint)(byte)cp_copy[1] << 0x14 |
                           (uint)(byte)cp_copy[2] << 0xc | (uint)(byte)cp_copy[3] << 4 |
                           (byte)cp_copy[4] & 0xf;
                local_124 = 5;
              }
              local_120 = local_124;
            }
            local_11c = local_120;
          }
          local_118 = local_11c;
        }
        hdr = (cram_block_compression_hdr *)(cp_copy + local_118);
        if ((byte)hdr->ref_seq_id < 0x80) {
          hd._4_4_ = ZEXT14((byte)hdr->ref_seq_id);
          local_128 = 1;
        }
        else {
          if ((byte)hdr->ref_seq_id < 0xc0) {
            hd._4_4_ = CONCAT11((char)hdr->ref_seq_id,*(undefined1 *)((long)&hdr->ref_seq_id + 1)) &
                       0x3fff;
            local_12c = 2;
          }
          else {
            if ((byte)hdr->ref_seq_id < 0xe0) {
              hd._4_4_ = ((byte)hdr->ref_seq_id & 0x1f) << 0x10 |
                         (uint)*(byte *)((long)&hdr->ref_seq_id + 1) << 8 |
                         (uint)*(byte *)((long)&hdr->ref_seq_id + 2);
              local_130 = 3;
            }
            else {
              if ((byte)hdr->ref_seq_id < 0xf0) {
                hd._4_4_ = ((byte)hdr->ref_seq_id & 0xf) << 0x18 |
                           (uint)*(byte *)((long)&hdr->ref_seq_id + 1) << 0x10 |
                           (uint)*(byte *)((long)&hdr->ref_seq_id + 2) << 8 |
                           (uint)*(byte *)((long)&hdr->ref_seq_id + 3);
                local_134 = 4;
              }
              else {
                hd._4_4_ = (uint)(byte)hdr->ref_seq_id << 0x1c |
                           (uint)*(byte *)((long)&hdr->ref_seq_id + 1) << 0x14 |
                           (uint)*(byte *)((long)&hdr->ref_seq_id + 2) << 0xc |
                           (uint)*(byte *)((long)&hdr->ref_seq_id + 3) << 4 |
                           (byte)hdr->ref_seq_start & 0xf;
                local_134 = 5;
              }
              local_130 = local_134;
            }
            local_12c = local_130;
          }
          local_128 = local_12c;
        }
        cp_copy = (char *)((long)&((cram_block_compression_hdr *)(hdr->substitution_matrix + -0xe))
                                  ->ref_seq_id + (long)local_128);
        for (map_count = 0; pcVar1 = cp_copy, map_count < (int)hd._4_4_; map_count = map_count + 1)
        {
          pcVar8 = (cram_metrics *)malloc(0x20);
          if (pcVar8 == (cram_metrics *)0x0) {
            cram_free_compression_header((cram_block_compression_hdr *)_map_size);
            return (cram_block_compression_hdr *)0x0;
          }
          pbVar5 = (byte *)(cp_copy + 2);
          if (*pbVar5 < 0x80) {
            m._4_4_ = (cram_encoding)*pbVar5;
            local_138 = 1;
          }
          else {
            if (*pbVar5 < 0xc0) {
              m._4_4_ = CONCAT11(*pbVar5,cp_copy[3]) & 0x3fff;
              local_13c = 2;
            }
            else {
              if (*pbVar5 < 0xe0) {
                m._4_4_ = (*pbVar5 & 0x1f) << 0x10 | (uint)(byte)cp_copy[3] << 8 |
                          (uint)(byte)cp_copy[4];
                local_140 = 3;
              }
              else {
                if (*pbVar5 < 0xf0) {
                  m._4_4_ = (*pbVar5 & 0xf) << 0x18 | (uint)(byte)cp_copy[3] << 0x10 |
                            (uint)(byte)cp_copy[4] << 8 | (uint)(byte)cp_copy[5];
                  local_144 = 4;
                }
                else {
                  m._4_4_ = (uint)*pbVar5 << 0x1c | (uint)(byte)cp_copy[3] << 0x14 |
                            (uint)(byte)cp_copy[4] << 0xc | (uint)(byte)cp_copy[5] << 4 |
                            (byte)cp_copy[6] & (E_GOLOMB_RICE|E_SUBEXP);
                  local_144 = 5;
                }
                local_140 = local_144;
              }
              local_13c = local_140;
            }
            local_138 = local_13c;
          }
          pbVar5 = pbVar5 + local_138;
          if (*pbVar5 < 0x80) {
            m._0_4_ = (uint)*pbVar5;
            local_148 = 1;
          }
          else {
            if (*pbVar5 < 0xc0) {
              m._0_4_ = CONCAT11(*pbVar5,pbVar5[1]) & 0x3fff;
              local_14c = 2;
            }
            else {
              if (*pbVar5 < 0xe0) {
                m._0_4_ = (*pbVar5 & 0x1f) << 0x10 | (uint)pbVar5[1] << 8 | (uint)pbVar5[2];
                local_150 = 3;
              }
              else {
                if (*pbVar5 < 0xf0) {
                  m._0_4_ = (*pbVar5 & 0xf) << 0x18 | (uint)pbVar5[1] << 0x10 | (uint)pbVar5[2] << 8
                            | (uint)pbVar5[3];
                  local_154 = 4;
                }
                else {
                  m._0_4_ = (uint)*pbVar5 << 0x1c | (uint)pbVar5[1] << 0x14 | (uint)pbVar5[2] << 0xc
                            | (uint)pbVar5[3] << 4 | pbVar5[4] & 0xf;
                  local_154 = 5;
                }
                local_150 = local_154;
              }
              local_14c = local_150;
            }
            local_148 = local_14c;
          }
          cp_copy = (char *)(pbVar5 + local_148);
          pcVar8->trial = (int)*pcVar1 << 8 | (int)pcVar1[1];
          pcVar8->next_trial = m._4_4_;
          pcVar8->sz_gz_def = (uint)m;
          pcVar8->sz_gz_rle = (int)cp_copy - (int)*(undefined8 *)(cp + 0x20);
          *(cram_codec **)&pcVar8->sz_rans0 = (cram_codec *)0x0;
          if (pcVar8->next_trial != E_NULL) {
            if ((*pcVar1 == 'B') && (pcVar1[1] == 'F')) {
              pcVar9 = cram_decoder_init(m._4_4_,cp_copy,(uint)m,E_INT,b_local->content_id);
              *(cram_codec **)(_map_size->bam_flag_swap + 0x31) = pcVar9;
              if (pcVar9 == (cram_codec *)0x0) {
                cram_free_compression_header((cram_block_compression_hdr *)_map_size);
                return (cram_block_compression_hdr *)0x0;
              }
            }
            else if ((*pcVar1 == 'C') && (pcVar1[1] == 'F')) {
              pcVar9 = cram_decoder_init(m._4_4_,cp_copy,(uint)m,E_INT,b_local->content_id);
              *(cram_codec **)(_map_size->bam_flag_swap + 0x33) = pcVar9;
              if (pcVar9 == (cram_codec *)0x0) {
                cram_free_compression_header((cram_block_compression_hdr *)_map_size);
                return (cram_block_compression_hdr *)0x0;
              }
            }
            else if ((*pcVar1 == 'R') && (pcVar1[1] == 'I')) {
              pcVar9 = cram_decoder_init(m._4_4_,cp_copy,(uint)m,E_INT,b_local->content_id);
              *(cram_codec **)(_map_size->bam_flag_swap + 0x55) = pcVar9;
              if (pcVar9 == (cram_codec *)0x0) {
                cram_free_compression_header((cram_block_compression_hdr *)_map_size);
                return (cram_block_compression_hdr *)0x0;
              }
            }
            else if ((*pcVar1 == 'R') && (pcVar1[1] == 'L')) {
              pcVar9 = cram_decoder_init(m._4_4_,cp_copy,(uint)m,E_INT,b_local->content_id);
              *(cram_codec **)(_map_size->bam_flag_swap + 0x45) = pcVar9;
              if (pcVar9 == (cram_codec *)0x0) {
                cram_free_compression_header((cram_block_compression_hdr *)_map_size);
                return (cram_block_compression_hdr *)0x0;
              }
            }
            else if ((*pcVar1 == 'A') && (pcVar1[1] == 'P')) {
              pcVar9 = cram_decoder_init(m._4_4_,cp_copy,(uint)m,E_INT,b_local->content_id);
              *(cram_codec **)(_map_size->bam_flag_swap + 0x35) = pcVar9;
              if (pcVar9 == (cram_codec *)0x0) {
                cram_free_compression_header((cram_block_compression_hdr *)_map_size);
                return (cram_block_compression_hdr *)0x0;
              }
            }
            else if ((*pcVar1 == 'R') && (pcVar1[1] == 'G')) {
              pcVar9 = cram_decoder_init(m._4_4_,cp_copy,(uint)m,E_INT,b_local->content_id);
              *(cram_codec **)(_map_size->bam_flag_swap + 0x37) = pcVar9;
              if (pcVar9 == (cram_codec *)0x0) {
                cram_free_compression_header((cram_block_compression_hdr *)_map_size);
                return (cram_block_compression_hdr *)0x0;
              }
            }
            else if ((*pcVar1 == 'M') && (pcVar1[1] == 'F')) {
              pcVar9 = cram_decoder_init(m._4_4_,cp_copy,(uint)m,E_INT,b_local->content_id);
              *(cram_codec **)(_map_size->bam_flag_swap + 0x3d) = pcVar9;
              if (pcVar9 == (cram_codec *)0x0) {
                cram_free_compression_header((cram_block_compression_hdr *)_map_size);
                return (cram_block_compression_hdr *)0x0;
              }
            }
            else if ((*pcVar1 == 'N') && (pcVar1[1] == 'S')) {
              pcVar9 = cram_decoder_init(m._4_4_,cp_copy,(uint)m,E_INT,b_local->content_id);
              *(cram_codec **)(_map_size->bam_flag_swap + 0x3b) = pcVar9;
              if (pcVar9 == (cram_codec *)0x0) {
                cram_free_compression_header((cram_block_compression_hdr *)_map_size);
                return (cram_block_compression_hdr *)0x0;
              }
            }
            else if ((*pcVar1 == 'N') && (pcVar1[1] == 'P')) {
              pcVar9 = cram_decoder_init(m._4_4_,cp_copy,(uint)m,E_INT,b_local->content_id);
              *(cram_codec **)(_map_size->bam_flag_swap + 0x41) = pcVar9;
              if (pcVar9 == (cram_codec *)0x0) {
                cram_free_compression_header((cram_block_compression_hdr *)_map_size);
                return (cram_block_compression_hdr *)0x0;
              }
            }
            else if ((*pcVar1 == 'T') && (pcVar1[1] == 'S')) {
              pcVar9 = cram_decoder_init(m._4_4_,cp_copy,(uint)m,E_INT,b_local->content_id);
              *(cram_codec **)(_map_size->bam_flag_swap + 0x3f) = pcVar9;
              if (pcVar9 == (cram_codec *)0x0) {
                cram_free_compression_header((cram_block_compression_hdr *)_map_size);
                return (cram_block_compression_hdr *)0x0;
              }
            }
            else if ((*pcVar1 == 'N') && (pcVar1[1] == 'F')) {
              pcVar9 = cram_decoder_init(m._4_4_,cp_copy,(uint)m,E_INT,b_local->content_id);
              *(cram_codec **)(_map_size->bam_flag_swap + 0x43) = pcVar9;
              if (pcVar9 == (cram_codec *)0x0) {
                cram_free_compression_header((cram_block_compression_hdr *)_map_size);
                return (cram_block_compression_hdr *)0x0;
              }
            }
            else if ((*pcVar1 == 'T') && (pcVar1[1] == 'C')) {
              pcVar9 = cram_decoder_init(m._4_4_,cp_copy,(uint)m,E_BYTE,b_local->content_id);
              *(cram_codec **)(_map_size->bam_flag_swap + 0x6b) = pcVar9;
              if (pcVar9 == (cram_codec *)0x0) {
                cram_free_compression_header((cram_block_compression_hdr *)_map_size);
                return (cram_block_compression_hdr *)0x0;
              }
            }
            else if ((*pcVar1 == 'T') && (pcVar1[1] == 'N')) {
              pcVar9 = cram_decoder_init(m._4_4_,cp_copy,(uint)m,E_INT,b_local->content_id);
              *(cram_codec **)(_map_size->bam_flag_swap + 0x61) = pcVar9;
              if (pcVar9 == (cram_codec *)0x0) {
                cram_free_compression_header((cram_block_compression_hdr *)_map_size);
                return (cram_block_compression_hdr *)0x0;
              }
            }
            else if ((*pcVar1 == 'F') && (pcVar1[1] == 'N')) {
              pcVar9 = cram_decoder_init(m._4_4_,cp_copy,(uint)m,E_INT,b_local->content_id);
              *(cram_codec **)(_map_size->bam_flag_swap + 0x47) = pcVar9;
              if (pcVar9 == (cram_codec *)0x0) {
                cram_free_compression_header((cram_block_compression_hdr *)_map_size);
                return (cram_block_compression_hdr *)0x0;
              }
            }
            else if ((*pcVar1 == 'F') && (pcVar1[1] == 'C')) {
              pcVar9 = cram_decoder_init(m._4_4_,cp_copy,(uint)m,E_BYTE,b_local->content_id);
              *(cram_codec **)(_map_size->bam_flag_swap + 0x49) = pcVar9;
              if (pcVar9 == (cram_codec *)0x0) {
                cram_free_compression_header((cram_block_compression_hdr *)_map_size);
                return (cram_block_compression_hdr *)0x0;
              }
            }
            else if ((*pcVar1 == 'F') && (pcVar1[1] == 'P')) {
              pcVar9 = cram_decoder_init(m._4_4_,cp_copy,(uint)m,E_INT,b_local->content_id);
              *(cram_codec **)(_map_size->bam_flag_swap + 0x4b) = pcVar9;
              if (pcVar9 == (cram_codec *)0x0) {
                cram_free_compression_header((cram_block_compression_hdr *)_map_size);
                return (cram_block_compression_hdr *)0x0;
              }
            }
            else if ((*pcVar1 == 'B') && (pcVar1[1] == 'S')) {
              pcVar9 = cram_decoder_init(m._4_4_,cp_copy,(uint)m,E_BYTE,b_local->content_id);
              *(cram_codec **)(_map_size->bam_flag_swap + 0x51) = pcVar9;
              if (pcVar9 == (cram_codec *)0x0) {
                cram_free_compression_header((cram_block_compression_hdr *)_map_size);
                return (cram_block_compression_hdr *)0x0;
              }
            }
            else if ((*pcVar1 == 'I') && (pcVar1[1] == 'N')) {
              pcVar9 = cram_decoder_init(m._4_4_,cp_copy,(uint)m,E_BYTE_ARRAY,b_local->content_id);
              *(cram_codec **)(_map_size->bam_flag_swap + 0x2d) = pcVar9;
              if (pcVar9 == (cram_codec *)0x0) {
                cram_free_compression_header((cram_block_compression_hdr *)_map_size);
                return (cram_block_compression_hdr *)0x0;
              }
            }
            else if ((*pcVar1 == 'S') && (pcVar1[1] == 'C')) {
              pcVar9 = cram_decoder_init(m._4_4_,cp_copy,(uint)m,E_BYTE_ARRAY,b_local->content_id);
              *(cram_codec **)(_map_size->bam_flag_swap + 0x2f) = pcVar9;
              if (pcVar9 == (cram_codec *)0x0) {
                cram_free_compression_header((cram_block_compression_hdr *)_map_size);
                return (cram_block_compression_hdr *)0x0;
              }
            }
            else if ((*pcVar1 == 'D') && (pcVar1[1] == 'L')) {
              pcVar9 = cram_decoder_init(m._4_4_,cp_copy,(uint)m,E_INT,b_local->content_id);
              *(cram_codec **)(_map_size->bam_flag_swap + 0x4d) = pcVar9;
              if (pcVar9 == (cram_codec *)0x0) {
                cram_free_compression_header((cram_block_compression_hdr *)_map_size);
                return (cram_block_compression_hdr *)0x0;
              }
            }
            else if ((*pcVar1 == 'B') && (pcVar1[1] == 'A')) {
              pcVar9 = cram_decoder_init(m._4_4_,cp_copy,(uint)m,E_BYTE,b_local->content_id);
              *(cram_codec **)(_map_size->bam_flag_swap + 0x4f) = pcVar9;
              if (pcVar9 == (cram_codec *)0x0) {
                cram_free_compression_header((cram_block_compression_hdr *)_map_size);
                return (cram_block_compression_hdr *)0x0;
              }
            }
            else if ((*pcVar1 == 'B') && (pcVar1[1] == 'B')) {
              pcVar9 = cram_decoder_init(m._4_4_,cp_copy,(uint)m,E_BYTE_ARRAY,b_local->content_id);
              *(cram_codec **)(_map_size->bam_flag_swap + 0x5d) = pcVar9;
              if (pcVar9 == (cram_codec *)0x0) {
                cram_free_compression_header((cram_block_compression_hdr *)_map_size);
                return (cram_block_compression_hdr *)0x0;
              }
            }
            else if ((*pcVar1 == 'R') && (pcVar1[1] == 'S')) {
              pcVar9 = cram_decoder_init(m._4_4_,cp_copy,(uint)m,E_INT,b_local->content_id);
              *(cram_codec **)(_map_size->bam_flag_swap + 0x57) = pcVar9;
              if (pcVar9 == (cram_codec *)0x0) {
                cram_free_compression_header((cram_block_compression_hdr *)_map_size);
                return (cram_block_compression_hdr *)0x0;
              }
            }
            else if ((*pcVar1 == 'P') && (pcVar1[1] == 'D')) {
              pcVar9 = cram_decoder_init(m._4_4_,cp_copy,(uint)m,E_INT,b_local->content_id);
              *(cram_codec **)(_map_size->bam_flag_swap + 0x59) = pcVar9;
              if (pcVar9 == (cram_codec *)0x0) {
                cram_free_compression_header((cram_block_compression_hdr *)_map_size);
                return (cram_block_compression_hdr *)0x0;
              }
            }
            else if ((*pcVar1 == 'H') && (pcVar1[1] == 'C')) {
              pcVar9 = cram_decoder_init(m._4_4_,cp_copy,(uint)m,E_INT,b_local->content_id);
              *(cram_codec **)(_map_size->bam_flag_swap + 0x5b) = pcVar9;
              if (pcVar9 == (cram_codec *)0x0) {
                cram_free_compression_header((cram_block_compression_hdr *)_map_size);
                return (cram_block_compression_hdr *)0x0;
              }
            }
            else if ((*pcVar1 == 'M') && (pcVar1[1] == 'Q')) {
              pcVar9 = cram_decoder_init(m._4_4_,cp_copy,(uint)m,E_INT,b_local->content_id);
              *(cram_codec **)(_map_size->bam_flag_swap + 0x39) = pcVar9;
              if (pcVar9 == (cram_codec *)0x0) {
                cram_free_compression_header((cram_block_compression_hdr *)_map_size);
                return (cram_block_compression_hdr *)0x0;
              }
            }
            else if ((*pcVar1 == 'R') && (pcVar1[1] == 'N')) {
              pcVar9 = cram_decoder_init(m._4_4_,cp_copy,(uint)m,E_BYTE_ARRAY_BLOCK,
                                         b_local->content_id);
              *(cram_codec **)(_map_size->bam_flag_swap + 0x29) = pcVar9;
              if (pcVar9 == (cram_codec *)0x0) {
                cram_free_compression_header((cram_block_compression_hdr *)_map_size);
                return (cram_block_compression_hdr *)0x0;
              }
            }
            else if ((*pcVar1 == 'Q') && (pcVar1[1] == 'S')) {
              pcVar9 = cram_decoder_init(m._4_4_,cp_copy,(uint)m,E_BYTE,b_local->content_id);
              *(cram_codec **)(_map_size->bam_flag_swap + 0x2b) = pcVar9;
              if (pcVar9 == (cram_codec *)0x0) {
                cram_free_compression_header((cram_block_compression_hdr *)_map_size);
                return (cram_block_compression_hdr *)0x0;
              }
            }
            else if ((*pcVar1 == 'Q') && (pcVar1[1] == 'Q')) {
              pcVar9 = cram_decoder_init(m._4_4_,cp_copy,(uint)m,E_BYTE_ARRAY,b_local->content_id);
              *(cram_codec **)(_map_size->bam_flag_swap + 0x5f) = pcVar9;
              if (pcVar9 == (cram_codec *)0x0) {
                cram_free_compression_header((cram_block_compression_hdr *)_map_size);
                return (cram_block_compression_hdr *)0x0;
              }
            }
            else if ((*pcVar1 == 'T') && (pcVar1[1] == 'L')) {
              pcVar9 = cram_decoder_init(m._4_4_,cp_copy,(uint)m,E_INT,b_local->content_id);
              *(cram_codec **)(_map_size->bam_flag_swap + 0x53) = pcVar9;
              if (pcVar9 == (cram_codec *)0x0) {
                cram_free_compression_header((cram_block_compression_hdr *)_map_size);
                return (cram_block_compression_hdr *)0x0;
              }
            }
            else if (((*pcVar1 != 'T') || (pcVar1[1] != 'M')) &&
                    ((*pcVar1 != 'T' || (pcVar1[1] != 'V')))) {
              fprintf(_stderr,"Unrecognised key: %.2s\n",pcVar1);
            }
            cp_copy = cp_copy + (int)(uint)m;
            *(cram_metrics **)&pcVar8->sz_bzip2 =
                 _map_size->m[(int)(*pcVar1 * 3 + (int)pcVar1[1] & 0x1f)];
            _map_size->m[(int)(*pcVar1 * 3 + (int)pcVar1[1] & 0x1f)] = pcVar8;
          }
        }
        if ((long)cp_copy - (long)hdr == (long)(int)local_40) {
          if ((byte)*cp_copy < 0x80) {
            local_40 = (uint)(byte)*cp_copy;
            local_158 = 1;
          }
          else {
            if ((byte)*cp_copy < 0xc0) {
              local_40 = CONCAT11(*cp_copy,cp_copy[1]) & 0x3fff;
              local_15c = 2;
            }
            else {
              if ((byte)*cp_copy < 0xe0) {
                local_40 = ((byte)*cp_copy & 0x1f) << 0x10 | (uint)(byte)cp_copy[1] << 8 |
                           (uint)(byte)cp_copy[2];
                local_160 = 3;
              }
              else {
                if ((byte)*cp_copy < 0xf0) {
                  local_40 = ((byte)*cp_copy & 0xf) << 0x18 | (uint)(byte)cp_copy[1] << 0x10 |
                             (uint)(byte)cp_copy[2] << 8 | (uint)(byte)cp_copy[3];
                  local_164 = 4;
                }
                else {
                  local_40 = (uint)(byte)*cp_copy << 0x1c | (uint)(byte)cp_copy[1] << 0x14 |
                             (uint)(byte)cp_copy[2] << 0xc | (uint)(byte)cp_copy[3] << 4 |
                             (byte)cp_copy[4] & 0xf;
                  local_164 = 5;
                }
                local_160 = local_164;
              }
              local_15c = local_160;
            }
            local_158 = local_15c;
          }
          hdr = (cram_block_compression_hdr *)(cp_copy + local_158);
          if ((byte)hdr->ref_seq_id < 0x80) {
            hd._4_4_ = ZEXT14((byte)hdr->ref_seq_id);
            local_168 = 1;
          }
          else {
            if ((byte)hdr->ref_seq_id < 0xc0) {
              hd._4_4_ = CONCAT11((char)hdr->ref_seq_id,*(undefined1 *)((long)&hdr->ref_seq_id + 1))
                         & 0x3fff;
              local_16c = 2;
            }
            else {
              if ((byte)hdr->ref_seq_id < 0xe0) {
                hd._4_4_ = ((byte)hdr->ref_seq_id & 0x1f) << 0x10 |
                           (uint)*(byte *)((long)&hdr->ref_seq_id + 1) << 8 |
                           (uint)*(byte *)((long)&hdr->ref_seq_id + 2);
                local_170 = 3;
              }
              else {
                if ((byte)hdr->ref_seq_id < 0xf0) {
                  hd._4_4_ = ((byte)hdr->ref_seq_id & 0xf) << 0x18 |
                             (uint)*(byte *)((long)&hdr->ref_seq_id + 1) << 0x10 |
                             (uint)*(byte *)((long)&hdr->ref_seq_id + 2) << 8 |
                             (uint)*(byte *)((long)&hdr->ref_seq_id + 3);
                  local_174 = 4;
                }
                else {
                  hd._4_4_ = (uint)(byte)hdr->ref_seq_id << 0x1c |
                             (uint)*(byte *)((long)&hdr->ref_seq_id + 1) << 0x14 |
                             (uint)*(byte *)((long)&hdr->ref_seq_id + 2) << 0xc |
                             (uint)*(byte *)((long)&hdr->ref_seq_id + 3) << 4 |
                             (byte)hdr->ref_seq_start & 0xf;
                  local_174 = 5;
                }
                local_170 = local_174;
              }
              local_16c = local_170;
            }
            local_168 = local_16c;
          }
          cp_copy = (char *)((long)&((cram_block_compression_hdr *)(hdr->substitution_matrix + -0xe)
                                    )->ref_seq_id + (long)local_168);
          for (map_count = 0; map_count < (int)hd._4_4_; map_count = map_count + 1) {
            pcVar8 = (cram_metrics *)malloc(0x20);
            pcVar1 = cp_copy;
            pcVar10 = cp_copy + 1;
            if (pcVar8 == (cram_metrics *)0x0) {
              cram_free_compression_header((cram_block_compression_hdr *)_map_size);
              return (cram_block_compression_hdr *)0x0;
            }
            pcVar8->trial = (int)*pcVar10 << 0x10 | (int)cp_copy[2] << 8 | (int)cp_copy[3];
            pbVar5 = (byte *)(cp_copy + 4);
            if (*pbVar5 < 0x80) {
              m_1._4_4_ = (cram_encoding)*pbVar5;
              local_178 = 1;
            }
            else {
              if (*pbVar5 < 0xc0) {
                m_1._4_4_ = CONCAT11(*pbVar5,cp_copy[5]) & 0x3fff;
                local_17c = 2;
              }
              else {
                if (*pbVar5 < 0xe0) {
                  m_1._4_4_ = (*pbVar5 & 0x1f) << 0x10 | (uint)(byte)cp_copy[5] << 8 |
                              (uint)(byte)cp_copy[6];
                  local_180 = 3;
                }
                else {
                  if (*pbVar5 < 0xf0) {
                    m_1._4_4_ = (*pbVar5 & 0xf) << 0x18 | (uint)(byte)cp_copy[5] << 0x10 |
                                (uint)(byte)cp_copy[6] << 8 | (uint)(byte)cp_copy[7];
                    local_184 = 4;
                  }
                  else {
                    m_1._4_4_ = (uint)*pbVar5 << 0x1c | (uint)(byte)cp_copy[5] << 0x14 |
                                (uint)(byte)cp_copy[6] << 0xc | (uint)(byte)cp_copy[7] << 4 |
                                (byte)cp_copy[8] & (E_GOLOMB_RICE|E_SUBEXP);
                    local_184 = 5;
                  }
                  local_180 = local_184;
                }
                local_17c = local_180;
              }
              local_178 = local_17c;
            }
            pbVar5 = pbVar5 + local_178;
            if (*pbVar5 < 0x80) {
              m_1._0_4_ = (uint)*pbVar5;
              local_188 = 1;
            }
            else {
              if (*pbVar5 < 0xc0) {
                m_1._0_4_ = CONCAT11(*pbVar5,pbVar5[1]) & 0x3fff;
                local_18c = 2;
              }
              else {
                if (*pbVar5 < 0xe0) {
                  m_1._0_4_ = (*pbVar5 & 0x1f) << 0x10 | (uint)pbVar5[1] << 8 | (uint)pbVar5[2];
                  local_190 = 3;
                }
                else {
                  if (*pbVar5 < 0xf0) {
                    m_1._0_4_ = (*pbVar5 & 0xf) << 0x18 | (uint)pbVar5[1] << 0x10 |
                                (uint)pbVar5[2] << 8 | (uint)pbVar5[3];
                    local_194 = 4;
                  }
                  else {
                    m_1._0_4_ = (uint)*pbVar5 << 0x1c | (uint)pbVar5[1] << 0x14 |
                                (uint)pbVar5[2] << 0xc | (uint)pbVar5[3] << 4 | pbVar5[4] & 0xf;
                    local_194 = 5;
                  }
                  local_190 = local_194;
                }
                local_18c = local_190;
              }
              local_188 = local_18c;
            }
            cp_copy = (char *)(pbVar5 + local_188);
            pcVar8->next_trial = m_1._4_4_;
            pcVar8->sz_gz_def = (uint)m_1;
            pcVar8->sz_gz_rle = (int)cp_copy - (int)*(undefined8 *)(cp + 0x20);
            pcVar9 = cram_decoder_init(m_1._4_4_,cp_copy,(uint)m_1,E_BYTE_ARRAY_BLOCK,
                                       b_local->content_id);
            *(cram_codec **)&pcVar8->sz_rans0 = pcVar9;
            if (pcVar9 == (cram_codec *)0x0) {
              cram_free_compression_header((cram_block_compression_hdr *)_map_size);
              free(pcVar8);
              return (cram_block_compression_hdr *)0x0;
            }
            cp_copy = cp_copy + (int)(uint)m_1;
            *(cram_metrics **)&pcVar8->sz_bzip2 =
                 _map_size->m[(long)(int)(*pcVar10 * 3 + (int)pcVar1[2] & 0x1f) + 0x20];
            _map_size->m[(long)(int)(*pcVar10 * 3 + (int)pcVar1[2] & 0x1f) + 0x20] = pcVar8;
          }
          if ((long)cp_copy - (long)hdr == (long)(int)local_40) {
            fd_local = _map_size;
          }
          else {
            cram_free_compression_header((cram_block_compression_hdr *)_map_size);
            fd_local = (cram_fd *)0x0;
          }
        }
        else {
          cram_free_compression_header((cram_block_compression_hdr *)_map_size);
          fd_local = (cram_fd *)0x0;
        }
      }
      else {
        cram_free_compression_header((cram_block_compression_hdr *)_map_size);
        fd_local = (cram_fd *)0x0;
      }
    }
  }
  else {
    free(_map_size);
    fd_local = (cram_fd *)0x0;
  }
  return (cram_block_compression_hdr *)fd_local;
}

Assistant:

cram_block_compression_hdr *cram_decode_compression_header(cram_fd *fd,
							   cram_block *b) {
    char *cp, *cp_copy;
    cram_block_compression_hdr *hdr = calloc(1, sizeof(*hdr));
    int i;
    int32_t map_size, map_count;

    if (!hdr)
	return NULL;

    if (b->method != RAW) {
	if (cram_uncompress_block(b)) {
	    free(hdr);
	    return NULL;
	}
    }

    cp = (char *)b->data;

    if (CRAM_MAJOR_VERS(fd->version) == 1) {
	cp += itf8_get(cp, &hdr->ref_seq_id);
	cp += itf8_get(cp, &hdr->ref_seq_start);
	cp += itf8_get(cp, &hdr->ref_seq_span);
	cp += itf8_get(cp, &hdr->num_records);
	cp += itf8_get(cp, &hdr->num_landmarks);
	if (!(hdr->landmark = malloc(hdr->num_landmarks * sizeof(int32_t)))) {
	    free(hdr);
	    return NULL;
	}
	for (i = 0; i < hdr->num_landmarks; i++) {
	    cp += itf8_get(cp, &hdr->landmark[i]);
	}
    }

    hdr->preservation_map = kh_init(map);

    memset(hdr->rec_encoding_map, 0,
	   CRAM_MAP_HASH * sizeof(hdr->rec_encoding_map[0]));
    memset(hdr->tag_encoding_map, 0,
	   CRAM_MAP_HASH * sizeof(hdr->tag_encoding_map[0]));

    if (!hdr->preservation_map) {
	cram_free_compression_header(hdr);
	return NULL;
    }

    /* Initialise defaults for preservation map */
    hdr->mapped_qs_included = 0;
    hdr->unmapped_qs_included = 0;
    hdr->unmapped_placed = 0;
    hdr->qs_included = 0;
    hdr->read_names_included = 0;
    hdr->AP_delta = 1;
    memcpy(hdr->substitution_matrix, "CGTNAGTNACTNACGNACGT", 20);

    /* Preservation map */
    cp += itf8_get(cp, &map_size); cp_copy = cp;
    cp += itf8_get(cp, &map_count);
    for (i = 0; i < map_count; i++) {
	pmap_t hd;
	khint_t k;
	int r;

	cp += 2;
	switch(CRAM_KEY(cp[-2],cp[-1])) {
	case CRAM_KEY('M','I'):
	    hd.i = *cp++;
	    k = kh_put(map, hdr->preservation_map, "MI", &r);
	    if (-1 == r) {
		cram_free_compression_header(hdr);
                return NULL;
            }

	    kh_val(hdr->preservation_map, k) = hd;
	    hdr->mapped_qs_included = hd.i;
	    break;

	case CRAM_KEY('U','I'):
	    hd.i = *cp++;
	    k = kh_put(map, hdr->preservation_map, "UI", &r);
	    if (-1 == r) {
		cram_free_compression_header(hdr);
                return NULL;
            }

	    kh_val(hdr->preservation_map, k) = hd;
	    hdr->unmapped_qs_included = hd.i;
	    break;

	case CRAM_KEY('P','I'):
	    hd.i = *cp++;
	    k = kh_put(map, hdr->preservation_map, "PI", &r);
	    if (-1 == r) {
		cram_free_compression_header(hdr);
                return NULL;
            }

	    kh_val(hdr->preservation_map, k) = hd;
	    hdr->unmapped_placed = hd.i;
	    break;

	case CRAM_KEY('R','N'):
	    hd.i = *cp++;
	    k = kh_put(map, hdr->preservation_map, "RN", &r);
	    if (-1 == r) {
		cram_free_compression_header(hdr);
                return NULL;
            }

	    kh_val(hdr->preservation_map, k) = hd;
	    hdr->read_names_included = hd.i;
	    break;

	case CRAM_KEY('A','P'):
	    hd.i = *cp++;
	    k = kh_put(map, hdr->preservation_map, "AP", &r);
	    if (-1 == r) {
		cram_free_compression_header(hdr);
                return NULL;
            }

	    kh_val(hdr->preservation_map, k) = hd;
	    hdr->AP_delta = hd.i;
	    break;

	case CRAM_KEY('R','R'):
	    hd.i = *cp++;
	    k = kh_put(map, hdr->preservation_map, "RR", &r);
	    if (-1 == r) {
		cram_free_compression_header(hdr);
                return NULL;
            }

	    kh_val(hdr->preservation_map, k) = hd;
	    fd->no_ref = !hd.i;
	    break;

	case CRAM_KEY('S','M'):
	    hdr->substitution_matrix[0][(cp[0]>>6)&3] = 'C';
	    hdr->substitution_matrix[0][(cp[0]>>4)&3] = 'G';
	    hdr->substitution_matrix[0][(cp[0]>>2)&3] = 'T';
	    hdr->substitution_matrix[0][(cp[0]>>0)&3] = 'N';

	    hdr->substitution_matrix[1][(cp[1]>>6)&3] = 'A';
	    hdr->substitution_matrix[1][(cp[1]>>4)&3] = 'G';
	    hdr->substitution_matrix[1][(cp[1]>>2)&3] = 'T';
	    hdr->substitution_matrix[1][(cp[1]>>0)&3] = 'N';

	    hdr->substitution_matrix[2][(cp[2]>>6)&3] = 'A';
	    hdr->substitution_matrix[2][(cp[2]>>4)&3] = 'C';
	    hdr->substitution_matrix[2][(cp[2]>>2)&3] = 'T';
	    hdr->substitution_matrix[2][(cp[2]>>0)&3] = 'N';

	    hdr->substitution_matrix[3][(cp[3]>>6)&3] = 'A';
	    hdr->substitution_matrix[3][(cp[3]>>4)&3] = 'C';
	    hdr->substitution_matrix[3][(cp[3]>>2)&3] = 'G';
	    hdr->substitution_matrix[3][(cp[3]>>0)&3] = 'N';

	    hdr->substitution_matrix[4][(cp[4]>>6)&3] = 'A';
	    hdr->substitution_matrix[4][(cp[4]>>4)&3] = 'C';
	    hdr->substitution_matrix[4][(cp[4]>>2)&3] = 'G';
	    hdr->substitution_matrix[4][(cp[4]>>0)&3] = 'T';

	    hd.p = cp;
	    cp += 5;

	    k = kh_put(map, hdr->preservation_map, "SM", &r);
	    if (-1 == r) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	    kh_val(hdr->preservation_map, k) = hd;
	    break;

	case CRAM_KEY('T','D'): {
	    int sz = cram_decode_TD(cp, hdr); // tag dictionary
	    if (sz < 0) {
		cram_free_compression_header(hdr);
		return NULL;
	    }

	    hd.p = cp;
	    cp += sz;

	    k = kh_put(map, hdr->preservation_map, "TD", &r);
	    if (-1 == r) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	    kh_val(hdr->preservation_map, k) = hd;
	    break;
	}

	default:
	    fprintf(stderr, "Unrecognised preservation map key %c%c\n",
		    cp[-2], cp[-1]);
	    // guess byte;
	    cp++;
	    break;
	}
    }
    if (cp - cp_copy != map_size) {
	cram_free_compression_header(hdr);
	return NULL;
    }

    /* Record encoding map */
    cp += itf8_get(cp, &map_size); cp_copy = cp;
    cp += itf8_get(cp, &map_count);
    for (i = 0; i < map_count; i++) {
	char *key = cp;
	int32_t encoding;
	int32_t size;
	cram_map *m = malloc(sizeof(*m)); // FIXME: use pooled_alloc

	if (!m) {
	    cram_free_compression_header(hdr);
	    return NULL;
	}

	cp += 2;
	cp += itf8_get(cp, &encoding);
	cp += itf8_get(cp, &size);

	// Fill out cram_map purely for cram_dump to dump out.
	m->key = (key[0]<<8)|key[1];
	m->encoding = encoding;
	m->size     = size;
	m->offset   = cp - (char *)b->data;
	m->codec = NULL;

	if (m->encoding == E_NULL)
	    continue;

	//printf("%s codes for %.2s\n", cram_encoding2str(encoding), key);

	/*
	 * For CRAM1.0 CF and BF are Byte and not Int.
	 * Practically speaking it makes no difference unless we have a
	 * 1.0 format file that stores these in EXTERNAL as only then
	 * does Byte vs Int matter.
	 *
	 * Neither this C code nor Java reference implementations did this,
	 * so we gloss over it and treat them as int.
	 */

	if (key[0] == 'B' && key[1] == 'F') {
	    if (!(hdr->codecs[DS_BF] = cram_decoder_init(encoding, cp, size,
							 E_INT,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'C' && key[1] == 'F') {
	    if (!(hdr->codecs[DS_CF] = cram_decoder_init(encoding, cp, size,
							 E_INT,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'R' && key[1] == 'I') {
	    if (!(hdr->codecs[DS_RI] = cram_decoder_init(encoding, cp, size,
							 E_INT,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'R' && key[1] == 'L') {
	    if (!(hdr->codecs[DS_RL] = cram_decoder_init(encoding, cp, size,
							 E_INT,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'A' && key[1] == 'P') {
	    if (!(hdr->codecs[DS_AP] = cram_decoder_init(encoding, cp, size,
							 E_INT,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'R' && key[1] == 'G') {
	    if (!(hdr->codecs[DS_RG] = cram_decoder_init(encoding, cp, size,
							 E_INT,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'M' && key[1] == 'F') {
	    if (!(hdr->codecs[DS_MF] = cram_decoder_init(encoding, cp, size,
							 E_INT,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'N' && key[1] == 'S') {
	    if (!(hdr->codecs[DS_NS] = cram_decoder_init(encoding, cp, size,
							 E_INT,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'N' && key[1] == 'P') {
	    if (!(hdr->codecs[DS_NP] = cram_decoder_init(encoding, cp, size,
							 E_INT,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'T' && key[1] == 'S') {
	    if (!(hdr->codecs[DS_TS] = cram_decoder_init(encoding, cp, size,
							 E_INT,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'N' && key[1] == 'F') {
	    if (!(hdr->codecs[DS_NF] = cram_decoder_init(encoding, cp, size,
							 E_INT,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'T' && key[1] == 'C') {
	    if (!(hdr->codecs[DS_TC] = cram_decoder_init(encoding, cp, size,
							 E_BYTE,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'T' && key[1] == 'N') {
	    if (!(hdr->codecs[DS_TN] = cram_decoder_init(encoding, cp, size,
							 E_INT,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'F' && key[1] == 'N') {
	    if (!(hdr->codecs[DS_FN] = cram_decoder_init(encoding, cp, size,
							 E_INT,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'F' && key[1] == 'C') {
	    if (!(hdr->codecs[DS_FC] = cram_decoder_init(encoding, cp, size,
							 E_BYTE,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'F' && key[1] == 'P') {
	    if (!(hdr->codecs[DS_FP] = cram_decoder_init(encoding, cp, size,
							 E_INT,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'B' && key[1] == 'S') {
	    if (!(hdr->codecs[DS_BS] = cram_decoder_init(encoding, cp, size,
							 E_BYTE,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'I' && key[1] == 'N') {
	    if (!(hdr->codecs[DS_IN] = cram_decoder_init(encoding, cp, size,
							 E_BYTE_ARRAY,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'S' && key[1] == 'C') {
	    if (!(hdr->codecs[DS_SC] = cram_decoder_init(encoding, cp, size,
							 E_BYTE_ARRAY,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'D' && key[1] == 'L') {
	    if (!(hdr->codecs[DS_DL] = cram_decoder_init(encoding, cp, size,
							 E_INT,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'B' && key[1] == 'A') {
	    if (!(hdr->codecs[DS_BA] = cram_decoder_init(encoding, cp, size,
							 E_BYTE,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'B' && key[1] == 'B') {
	    if (!(hdr->codecs[DS_BB] = cram_decoder_init(encoding, cp, size,
							 E_BYTE_ARRAY,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'R' && key[1] == 'S') {
	    if (!(hdr->codecs[DS_RS] = cram_decoder_init(encoding, cp, size,
							 E_INT,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'P' && key[1] == 'D') {
	    if (!(hdr->codecs[DS_PD] = cram_decoder_init(encoding, cp, size,
							 E_INT,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'H' && key[1] == 'C') {
	    if (!(hdr->codecs[DS_HC] = cram_decoder_init(encoding, cp, size,
							 E_INT,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'M' && key[1] == 'Q') {
	    if (!(hdr->codecs[DS_MQ] = cram_decoder_init(encoding, cp, size,
							 E_INT,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'R' && key[1] == 'N') {
	    if (!(hdr->codecs[DS_RN] = cram_decoder_init(encoding, cp, size,
							 E_BYTE_ARRAY_BLOCK,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'Q' && key[1] == 'S') {
	    if (!(hdr->codecs[DS_QS] = cram_decoder_init(encoding, cp, size,
							 E_BYTE,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'Q' && key[1] == 'Q') {
	    if (!(hdr->codecs[DS_QQ] = cram_decoder_init(encoding, cp, size,
							 E_BYTE_ARRAY,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'T' && key[1] == 'L') {
	    if (!(hdr->codecs[DS_TL] = cram_decoder_init(encoding, cp, size,
							 E_INT,
							 fd->version))) {
		cram_free_compression_header(hdr);
		return NULL;
	    }
	} else if (key[0] == 'T' && key[1] == 'M') {
	} else if (key[0] == 'T' && key[1] == 'V') {
	} else
	    fprintf(stderr, "Unrecognised key: %.2s\n", key);

	cp += size;

	m->next = hdr->rec_encoding_map[CRAM_MAP(key[0], key[1])];
	hdr->rec_encoding_map[CRAM_MAP(key[0], key[1])] = m;
    }
    if (cp - cp_copy != map_size) {
	cram_free_compression_header(hdr);
	return NULL;
    }

    /* Tag encoding map */
    cp += itf8_get(cp, &map_size); cp_copy = cp;
    cp += itf8_get(cp, &map_count);
    for (i = 0; i < map_count; i++) {
	int32_t encoding;
	int32_t size;
	cram_map *m = malloc(sizeof(*m)); // FIXME: use pooled_alloc
	char *key = cp+1;

	if (!m) {
	    cram_free_compression_header(hdr);
	    return NULL;
	}

	m->key = (key[0]<<16)|(key[1]<<8)|key[2];

	cp += 4; // Strictly ITF8, but this suffices
	cp += itf8_get(cp, &encoding);
	cp += itf8_get(cp, &size);

	m->encoding = encoding;
	m->size     = size;
	m->offset   = cp - (char *)b->data;
	if (!(m->codec = cram_decoder_init(encoding, cp, size,
					   E_BYTE_ARRAY_BLOCK, fd->version))) {
	    cram_free_compression_header(hdr);
	    free(m);
	    return NULL;
	}
	
	cp += size;

	m->next = hdr->tag_encoding_map[CRAM_MAP(key[0],key[1])];
	hdr->tag_encoding_map[CRAM_MAP(key[0],key[1])] = m;
    }
    if (cp - cp_copy != map_size) {
	cram_free_compression_header(hdr);
	return NULL;
    }

    return hdr;
}